

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *globalLayouts)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  allocator<char> local_51;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string *local_30 [2];
  _Alloc_hider local_20;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,(char *)this,&local_51);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x1c449f8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  psVar3 = (string *)&local_20;
  if (local_30[0] != psVar3) {
    operator_delete(local_30[0],(ulong)(local_20._M_p + 1));
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string TessProgramQueryCase::getTessEvalSource (const char* globalLayouts) const
{
	return	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			+ std::string(globalLayouts) + ";\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n"
			"	            + gl_TessCoord.y * gl_in[1].gl_Position\n"
			"	            + gl_TessCoord.y * gl_in[2].gl_Position\n"
			"	            + gl_TessCoord.z * gl_in[3].gl_Position;\n"
			"}\n";
}